

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O0

Position * __thiscall iDynTree::SpatialInertia::getCenterOfMass(SpatialInertia *this)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *in_RSI;
  VectorFixSize<3U> *in_RDI;
  Position *ret;
  
  Position::Position((Position *)0x6f3afa);
  if (ABS(*in_RSI) <= 0.0) {
    VectorFixSize<3U>::zero(in_RDI);
  }
  else {
    dVar1 = in_RSI[1];
    dVar2 = *in_RSI;
    pdVar3 = VectorFixSize<3U>::operator()(in_RDI,0);
    *pdVar3 = dVar1 / dVar2;
    dVar1 = in_RSI[2];
    dVar2 = *in_RSI;
    pdVar3 = VectorFixSize<3U>::operator()(in_RDI,1);
    *pdVar3 = dVar1 / dVar2;
    dVar1 = in_RSI[3];
    dVar2 = *in_RSI;
    pdVar3 = VectorFixSize<3U>::operator()(in_RDI,2);
    *pdVar3 = dVar1 / dVar2;
  }
  return (Position *)in_RDI;
}

Assistant:

Position SpatialInertia::getCenterOfMass() const
{
    Position ret;

    if( fabs(this->m_mass) > 0 )
    {
        ret(0) = this->m_mcom[0]/this->m_mass;
        ret(1) = this->m_mcom[1]/this->m_mass;
        ret(2) = this->m_mcom[2]/this->m_mass;
    }
    else
    {
        ret.zero();
    }

    return ret;
}